

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O2

void send_cb(uv_udp_send_t *req,int status)

{
  send_cb_called = send_cb_called + 1;
  return;
}

Assistant:

static void send_cb(uv_udp_send_t* req, int status) {
  ASSERT_NOT_NULL(req);
  ASSERT_OK(status);
  ASSERT_OK(status);
  CHECK_HANDLE(req->handle);
  send_cb_called++;
}